

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_count.cpp
# Opt level: O0

void __thiscall
BitCount_PopCountUChar_Test::BitCount_PopCountUChar_Test(BitCount_PopCountUChar_Test *this)

{
  BitCount_PopCountUChar_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__BitCount_PopCountUChar_Test_0031a298;
  return;
}

Assistant:

TEST (BitCount, PopCountUChar) {
    std::uint8_t bitmap = 0;
    EXPECT_EQ (0U, pstore::bit_count::pop_count (bitmap));
    bitmap = 0xF0;
    EXPECT_EQ (4U, pstore::bit_count::pop_count (bitmap));
    bitmap = 0xFF;
    EXPECT_EQ (8U, pstore::bit_count::pop_count (bitmap));
}